

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall FastLinearExpert<1,_1>::m_step(FastLinearExpert<1,_1> *this)

{
  type tmp;
  double dVar1;
  double dVar2;
  Scal SVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar2 = (this->super_LinearExpert<1,_1>).wNu;
  dVar1 = (this->super_LinearExpert<1,_1>).Sh;
  dVar6 = (this->super_LinearExpert<1,_1>).Sz.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  dVar4 = dVar1 + dVar2;
  dVar8 = dVar6 / dVar1;
  dVar7 = (this->super_LinearExpert<1,_1>).Sx.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] /
          dVar1;
  dVar6 = (double)(-(ulong)(dVar2 == 0.0) & (ulong)dVar8 |
                  ~-(ulong)(dVar2 == 0.0) &
                  (ulong)(((this->super_LinearExpert<1,_1>).Nu0.
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
                           m_data.array[0] * dVar2 + dVar6) / dVar4));
  (this->super_LinearExpert<1,_1>).Nu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = dVar6;
  dVar1 = dVar1 + (this->super_LinearExpert<1,_1>).wSigma;
  dVar2 = (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0];
  dVar5 = dVar2 * dVar6;
  dVar6 = -1.0 / dVar4 + dVar6 * dVar5;
  (this->super_LinearExpert<1,_1>).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (dVar2 - (dVar5 / dVar6) * dVar5) * dVar1;
  dVar2 = ((dVar1 / dVar4) / dVar6) * -this->detInvSzz0;
  if (dVar2 < 0.0) {
    SVar3 = sqrt(dVar2);
  }
  else {
    SVar3 = SQRT(dVar2);
  }
  (this->super_LinearExpert<1,_1>).sqrtDetInvSigma = SVar3;
  dVar2 = (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0];
  dVar1 = (this->super_LinearExpert<1,_1>).Sz.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  dVar5 = dVar2 * dVar1;
  dVar6 = (this->super_LinearExpert<1,_1>).Nu.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0];
  dVar4 = (this->super_LinearExpert<1,_1>).Sh;
  dVar2 = dVar2 - (dVar5 / (dVar1 * dVar5 - dVar4)) * dVar5;
  (this->super_LinearExpert<1,_1>).varLambda.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar2;
  dVar1 = (this->super_LinearExpert<1,_1>).Sxz.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] -
          dVar1 * dVar7;
  dVar2 = dVar2 * dVar1;
  (this->super_LinearExpert<1,_1>).Lambda.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar2;
  (this->super_LinearExpert<1,_1>).Mu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = (dVar6 - dVar8) * dVar2 + dVar7;
  dVar2 = ((this->super_LinearExpert<1,_1>).Sxx.
           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] -
          (dVar2 * dVar1 +
          dVar7 * (this->super_LinearExpert<1,_1>).Sx.
                  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
                  array[0])) / (dVar4 + (this->super_LinearExpert<1,_1>).wPsi + 2.0);
  (this->super_LinearExpert<1,_1>).Psi.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = dVar2;
  dVar2 = 1.0 / dVar2;
  (this->super_LinearExpert<1,_1>).invPsi.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar2;
  if (dVar2 < 0.0) {
    SVar3 = sqrt(dVar2);
  }
  else {
    SVar3 = SQRT(dVar2);
  }
  (this->super_LinearExpert<1,_1>).sqrtDetInvPsi = SVar3;
  (this->super_LinearExpert<1,_1>).recompute = true;
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void FAST_LINEAR_EXPERT_base::m_step()
{
	Z SZ;
	Scal DEN;
	Scal ShSigma = Sh + wSigma, ShNu = Sh + wNu;
    Z meanZ = Sz / Sh;
    X meanX = Sx / Sh;

    if( wNu == 0.0 )
        Nu = meanZ;
    else
        Nu = (Sz + wNu*Nu0) / ShNu;

	// Using Moore-Penrose Rank-1 downdate
	SZ = invSzz0 * Nu;
	DEN = Nu.dot(SZ) - 1.0/ShNu;
	invSigma = (invSzz0 - (SZ/DEN) * SZ.transpose()) * ShSigma;
	// Using Determinant Rank-1 downdate
	sqrtDetInvSigma = sqrt( -detInvSzz0 * ( pow(ShSigma,d) / ShNu / DEN) );


	// Using Moore-Penrose Rank-1 update
	SZ = invSzz * Sz;
	DEN = Sz.dot(SZ) - Sh;
	varLambda = invSzz - (SZ/DEN) * SZ.transpose();

    XZ xz = Sxz;
    xz.noalias() -= meanX*Sz.transpose();
    Lambda.noalias() = xz * varLambda;
    Mu = meanX;
    Mu.noalias() += Lambda * (Nu - meanZ);

    Psi = Sxx;
//Psi += wPsi * mixture->getPsi();
    Psi.noalias() -= meanX.cwiseProduct(Sx) + xz.cwiseProduct(Lambda).rowwise().sum();
    Psi /= (wPsi + Sh + 2.0 );
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

    recompute = true;
}